

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O3

void node::
     index_tree<node::TreeIndexAPTED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
               (TreeIndexAPTED *ti,Node<label::StringLabel> *n,
               LabelDictionary<label::StringLabel> *ld,UnitCostModelLD<label::StringLabel> *cm)

{
  PreLToSize *this;
  vector<int,_std::allocator<int>_> *this_00;
  uint uVar1;
  pointer __s;
  pointer piVar2;
  ulong *puVar3;
  pointer plVar4;
  pointer plVar5;
  pointer pdVar6;
  pointer pdVar7;
  int iVar8;
  size_type __new_size;
  ulong *puVar9;
  int height;
  int subtree_max_depth;
  int start_postorder;
  int start_preorder;
  
  iVar8 = Node<label::StringLabel>::get_tree_size(n);
  (ti->super_Constants).tree_size_ = iVar8;
  this = &ti->super_PreLToSize;
  __new_size = (size_type)iVar8;
  std::vector<int,_std::allocator<int>_>::resize(&this->prel_to_size_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PreLToParent).prel_to_parent_,__new_size);
  __s = (ti->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start;
  piVar2 = (ti->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__s != piVar2) {
    memset(__s,0xff,((long)piVar2 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PostLToPreL).postl_to_prel_,__new_size)
  ;
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreLToPostL).prel_to_postl_,__new_size)
  ;
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreLToPreR).prel_to_prer_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreRToPreL).prer_to_prel_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreLToPostR).prel_to_postr_,__new_size)
  ;
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PostRToPreL).postr_to_prel_,__new_size)
  ;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&(ti->super_PreLToChildren).prel_to_children_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PreLToLabelId).prel_to_label_id_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToLabelId).postl_to_label_id_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostRToLabelId).postr_to_label_id_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PostLToLLD).postl_to_lld_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreLToLLD).prel_to_lld_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreLToRLD).prel_to_rld_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PostRToRLD).postr_to_rld_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreToLn).prel_to_ln_,__new_size);
  this_00 = &(ti->super_PreToLn).prer_to_ln_;
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  std::vector<bool,_std::allocator<bool>_>::resize
            (&(ti->super_PreLToTypeLeft).prel_to_type_left_,__new_size,false);
  puVar9 = (ti->super_PreLToTypeLeft).prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar3 = (ti->super_PreLToTypeLeft).prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = *(uint *)((long)&(ti->super_PreLToTypeLeft).prel_to_type_left_.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
  if (puVar9 != puVar3) {
    memset(puVar9,0,(long)puVar3 - (long)puVar9);
    puVar9 = puVar3;
  }
  if (uVar1 != 0) {
    *puVar9 = *puVar9 & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  std::vector<bool,_std::allocator<bool>_>::resize
            (&(ti->super_PreLToTypeRight).prel_to_type_right_,__new_size,false);
  puVar9 = (ti->super_PreLToTypeRight).prel_to_type_right_.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p;
  puVar3 = (ti->super_PreLToTypeRight).prel_to_type_right_.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p;
  uVar1 = *(uint *)((long)&(ti->super_PreLToTypeRight).prel_to_type_right_.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
  if (puVar9 != puVar3) {
    memset(puVar9,0,(long)puVar3 - (long)puVar9);
    puVar9 = puVar3;
  }
  if (uVar1 != 0) {
    *puVar9 = *puVar9 & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  std::vector<long_long,_std::allocator<long_long>_>::resize
            (&(ti->super_PreLToSpfCost).prel_to_cost_all_,__new_size);
  plVar4 = (ti->super_PreLToSpfCost).prel_to_cost_all_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  plVar5 = (ti->super_PreLToSpfCost).prel_to_cost_all_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (plVar4 != plVar5) {
    memset(plVar4,0,((long)plVar5 + (-8 - (long)plVar4) & 0xfffffffffffffff8U) + 8);
  }
  std::vector<long_long,_std::allocator<long_long>_>::resize
            (&(ti->super_PreLToSpfCost).prel_to_cost_left_,__new_size);
  plVar4 = (ti->super_PreLToSpfCost).prel_to_cost_left_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  plVar5 = (ti->super_PreLToSpfCost).prel_to_cost_left_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (plVar4 != plVar5) {
    memset(plVar4,0,((long)plVar5 + (-8 - (long)plVar4) & 0xfffffffffffffff8U) + 8);
  }
  std::vector<long_long,_std::allocator<long_long>_>::resize
            (&(ti->super_PreLToSpfCost).prel_to_cost_right_,__new_size);
  plVar4 = (ti->super_PreLToSpfCost).prel_to_cost_right_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  plVar5 = (ti->super_PreLToSpfCost).prel_to_cost_right_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (plVar4 != plVar5) {
    memset(plVar4,0,((long)plVar5 + (-8 - (long)plVar4) & 0xfffffffffffffff8U) + 8);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&(ti->super_PreLToSubtreeCost).prel_to_subtree_del_cost_,__new_size);
  pdVar6 = (ti->super_PreLToSubtreeCost).prel_to_subtree_del_cost_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar7 = (ti->super_PreLToSubtreeCost).prel_to_subtree_del_cost_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar6 != pdVar7) {
    memset(pdVar6,0,((long)pdVar7 + (-8 - (long)pdVar6) & 0xfffffffffffffff8U) + 8);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&(ti->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_,__new_size);
  pdVar6 = (ti->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar7 = (ti->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar6 != pdVar7) {
    memset(pdVar6,0,((long)pdVar7 + (-8 - (long)pdVar6) & 0xfffffffffffffff8U) + 8);
  }
  start_preorder = 0;
  start_postorder = 0;
  subtree_max_depth = 0;
  height = 0;
  index_tree_recursion<node::TreeIndexAPTED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
            (ti,n,ld,cm,&start_preorder,&start_postorder,0,&subtree_max_depth,0,&height,-1,false);
  fill_ln(&(ti->super_PreToLn).prel_to_ln_,this_00,&this->prel_to_size_,
          &(ti->super_PreRToPreL).prer_to_prel_);
  fill_rld(&(ti->super_PostRToRLD).postr_to_rld_,&this->prel_to_size_,
           &(ti->super_PostRToPreL).postr_to_prel_,&(ti->super_PreLToPostR).prel_to_postr_,
           &(ti->super_PreLToChildren).prel_to_children_);
  return;
}

Assistant:

void index_tree(TreeIndex& ti, const node::Node<Label>& n,
    label::LabelDictionary<Label>& ld, const CostModel& cm) {
  
  int tree_size = n.get_tree_size();
  ti.tree_size_ = tree_size;
  
  // Resize and clear the indexes.
  // TODO: Resizing is not enough for some vectors in case the same TreeIndex
  //       object is used for multiple trees. Old incorrect values may remain
  //       in the vectors.
  if constexpr (std::is_base_of<PostLToSize, TreeIndex>::value) {
    ti.postl_to_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToSize, TreeIndex>::value) {
    ti.prel_to_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToParent, TreeIndex>::value) {
    ti.postl_to_parent_.resize(tree_size);
    std::fill(ti.postl_to_parent_.begin(), ti.postl_to_parent_.end(), -1);
  }
  if constexpr (std::is_base_of<PreLToParent, TreeIndex>::value) {
    ti.prel_to_parent_.resize(tree_size);
    std::fill(ti.prel_to_parent_.begin(), ti.prel_to_parent_.end(), -1);
  }
  if constexpr (std::is_base_of<PostLToPreL, TreeIndex>::value) {
    ti.postl_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPostL, TreeIndex>::value) {
    ti.prel_to_postl_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPreR, TreeIndex>::value) {
    ti.prel_to_prer_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreRToPreL, TreeIndex>::value) {
    ti.prer_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPostR, TreeIndex>::value) {
    ti.prel_to_postr_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToPreL, TreeIndex>::value) {
    ti.postr_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToChildren, TreeIndex>::value) {
    ti.postl_to_children_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToChildren, TreeIndex>::value) {
    ti.prel_to_children_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToLabelId, TreeIndex>::value) {
    ti.prel_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLabelId, TreeIndex>::value) {
    ti.postl_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToType, TreeIndex>::value) {
    ti.postl_to_type_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToLabelId, TreeIndex>::value) {
    ti.postr_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLLD, TreeIndex>::value) {
    ti.postl_to_lld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToLLD, TreeIndex>::value) {
    ti.prel_to_lld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToRLD, TreeIndex>::value) {
    ti.prel_to_rld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToRLD, TreeIndex>::value) {
    ti.postr_to_rld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToDepth, TreeIndex>::value) {
    ti.postl_to_depth_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLCh, TreeIndex>::value) {
    ti.postl_to_lch_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToSubtreeMaxDepth, TreeIndex>::value) {
    ti.postl_to_subtree_max_depth_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToKRAncestor, TreeIndex>::value) {
    ti.postl_to_kr_ancestor_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreToLn, TreeIndex>::value) {
    ti.prel_to_ln_.resize(tree_size);
    ti.prer_to_ln_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToTypeLeft, TreeIndex>::value) {
    ti.prel_to_type_left_.resize(tree_size);
    std::fill(ti.prel_to_type_left_.begin(), ti.prel_to_type_left_.end(), false);
  }
  if constexpr (std::is_base_of<PreLToTypeRight, TreeIndex>::value) {
    ti.prel_to_type_right_.resize(tree_size);
    std::fill(ti.prel_to_type_right_.begin(), ti.prel_to_type_right_.end(), false);
  }
  if constexpr (std::is_base_of<PreLToSpfCost, TreeIndex>::value) {
    ti.prel_to_cost_all_.resize(tree_size);
    std::fill(ti.prel_to_cost_all_.begin(), ti.prel_to_cost_all_.end(), 0);
    ti.prel_to_cost_left_.resize(tree_size);
    std::fill(ti.prel_to_cost_left_.begin(), ti.prel_to_cost_left_.end(), 0);
    ti.prel_to_cost_right_.resize(tree_size);
    std::fill(ti.prel_to_cost_right_.begin(), ti.prel_to_cost_right_.end(), 0);
  }
  if constexpr (std::is_base_of<PreLToSubtreeCost, TreeIndex>::value) {
    ti.prel_to_subtree_del_cost_.resize(tree_size);
    std::fill(ti.prel_to_subtree_del_cost_.begin(), ti.prel_to_subtree_del_cost_.end(), 0.0);
    ti.prel_to_subtree_ins_cost_.resize(tree_size);
    std::fill(ti.prel_to_subtree_ins_cost_.begin(), ti.prel_to_subtree_ins_cost_.end(), 0.0);
  }
  if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
    ti.list_kr_.clear();
  }
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    ti.inverted_list_depth_to_postl_.clear();
  }
  if constexpr (std::is_base_of<InvertedListLabelIdToPostL, TreeIndex>::value) {
    ti.inverted_list_label_id_to_postl_.clear();
  }
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_fav_child_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_left_fav_child_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    ti.postl_to_height_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToOrderedChildSize, TreeIndex>::value) {
    ti.postl_to_ordered_child_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToFavorableChildOrder, TreeIndex>::value) {
    ti.postl_to_favorder_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLeftSibling, TreeIndex>::value) {
    ti.postl_to_left_sibling_.resize(tree_size);
  }

  // Orders start with '0'. Are modified by the recursive traversal.
  int start_preorder = 0;
  int start_postorder = 0;
  int start_depth = 0;
  int start_height = 0;

  // Maximum input tree depth - the first reference passed to recursion.
  int subtree_max_depth = 0;
  // Initial height.
  int height = 0;
  index_tree_recursion(ti, n, ld, cm, start_preorder, start_postorder,
      start_depth, subtree_max_depth, start_height, height, -1, false);
  
  if constexpr (std::is_base_of<PostLToFavorableChildOrder, TreeIndex>::value) {
    // Compute favorable child order.
    int ts = tree_size - 1;
    int fid = 0;
    fav_child_processing_order(ti, ts, fid);
  }

  if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
    // Add root to kr - not added in the recursion.
    ti.list_kr_.push_back(start_postorder-1);
  }

  if constexpr (std::is_base_of<PostLToKRAncestor, TreeIndex>::value) {
    fill_kr_ancestors(ti.postl_to_kr_ancestor_, ti.postl_to_lch_, ti.list_kr_);
  }

  if constexpr (std::is_base_of<PreToLn, TreeIndex>::value) {
    fill_ln(ti.prel_to_ln_, ti.prer_to_ln_, ti.prel_to_size_, ti.prer_to_prel_);
  }

  if constexpr (std::is_base_of<PostRToRLD, TreeIndex>::value) {
    fill_rld(ti.postr_to_rld_, ti.prel_to_size_, ti.postr_to_prel_,
        ti.prel_to_postr_, ti.prel_to_children_);
  }
}